

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileDefinitionsCommand.cxx
# Opt level: O2

string * __thiscall
cmTargetCompileDefinitionsCommand::Join
          (string *__return_storage_ptr__,cmTargetCompileDefinitionsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer __rhs;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sep._M_dataplus._M_p = (pointer)&sep.field_2;
  sep._M_string_length = 0;
  sep.field_2._M_local_buf[0] = '\0';
  for (__rhs = (content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __rhs != (content->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    bVar1 = cmHasLiteralPrefix<char_const*,3ul>((__rhs->_M_dataplus)._M_p,(char (*) [3])0x47fcbf);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)__rhs);
      std::operator+(&local_70,&sep,&local_50);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_50;
    }
    else {
      std::operator+(&local_70,&sep,__rhs);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_00 = &local_70;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::assign((char *)&sep);
  }
  std::__cxx11::string::~string((string *)&sep);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTargetCompileDefinitionsCommand
::Join(const std::vector<std::string> &content)
{
  std::string defs;
  std::string sep;
  for(std::vector<std::string>::const_iterator it = content.begin();
    it != content.end(); ++it)
    {
    if (cmHasLiteralPrefix(it->c_str(), "-D"))
      {
      defs += sep + it->substr(2);
      }
    else
      {
      defs += sep + *it;
      }
    sep = ";";
    }
  return defs;
}